

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  ushort uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint32_t total_bits_7;
  uint32_t len_7;
  uint64_t val_7;
  uint32_t total_bits_6;
  uint32_t len_6;
  uint64_t val_6;
  uint32_t total_bits_5;
  uint32_t len_5;
  uint64_t val_5;
  uint32_t total_bits_4;
  uint32_t len_4;
  uint64_t val_4;
  uint32_t total_bits_3;
  uint32_t len_3;
  uint64_t val_3;
  uint32_t total_bits_2;
  uint32_t len_2;
  uint64_t val_2;
  uint32_t total_bits_1;
  uint32_t len_1;
  uint64_t val_1;
  uint32_t total_bits;
  uint32_t len;
  uint64_t val;
  uint64_t bi_buf;
  uint32_t bi_valid;
  int min_count;
  int max_count;
  int count;
  int nextlen;
  int curlen;
  int prevlen;
  int n;
  uint64_t in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined8 local_40;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_1c;
  undefined4 local_18;
  
  local_1c = 0xffffffff;
  local_28 = 0;
  local_2c = 7;
  local_30 = 4;
  if (*(ushort *)(in_RSI + 2) == 0) {
    local_2c = 0x8a;
    local_30 = 3;
  }
  local_34 = *(uint *)(in_RDI + 0x1780);
  local_40 = *(ulong *)(in_RDI + 0x1778);
  local_24 = (uint)*(ushort *)(in_RSI + 2);
  for (local_18 = 0; local_18 <= in_EDX; local_18 = local_18 + 1) {
    uVar4 = (uint)*(ushort *)(in_RSI + 2 + (long)(local_18 + 1) * 4);
    iVar5 = local_28 + 1;
    if ((local_2c <= iVar5) || (local_24 != uVar4)) {
      if (iVar5 < local_30) {
        do {
          local_28 = iVar5;
          uVar1 = *(ushort *)(in_RDI + 0xaec + (long)(int)local_24 * 4);
          uVar7 = (uint)*(ushort *)(in_RDI + 0xaee + (long)(int)local_24 * 4);
          uVar6 = local_34 + uVar7;
          if ((uVar6 < 0x40) && (local_34 < 0x40)) {
            local_40 = (ulong)uVar1 << ((byte)local_34 & 0x3f) | local_40;
            local_34 = uVar6;
          }
          else if (local_34 < 0x40) {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_40 = (ulong)(uVar1 >> (0x40 - (byte)local_34 & 0x3f));
            local_34 = uVar6 - 0x40;
          }
          else {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_40 = (ulong)uVar1;
            local_34 = uVar7;
          }
          iVar5 = local_28 + -1;
        } while (local_28 + -1 != 0);
      }
      else {
        bVar3 = (byte)local_34;
        if (local_24 == 0) {
          if (iVar5 < 0xb) {
            uVar1 = *(ushort *)(in_RDI + 0xb30);
            uVar2 = *(ushort *)(in_RDI + 0xb32);
            uVar7 = local_34 + uVar2;
            if ((uVar7 < 0x40) && (local_34 < 0x40)) {
              local_40 = (ulong)uVar1 << (bVar3 & 0x3f) | local_40;
              local_34 = uVar7;
            }
            else if (local_34 < 0x40) {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)(uVar1 >> (0x40 - bVar3 & 0x3f));
              local_34 = uVar7 - 0x40;
            }
            else {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)uVar1;
              local_34 = (uint)uVar2;
            }
            uVar8 = (long)iVar5 - 3;
            if ((local_34 + 3 < 0x40) && (local_34 < 0x40)) {
              local_40 = uVar8 << ((byte)local_34 & 0x3f) | local_40;
              local_34 = local_34 + 3;
            }
            else if (local_34 < 0x40) {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = uVar8 >> (0x40 - (byte)local_34 & 0x3f);
              local_34 = local_34 - 0x3d;
            }
            else {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_34 = 3;
              local_40 = uVar8;
            }
          }
          else {
            uVar1 = *(ushort *)(in_RDI + 0xb34);
            uVar2 = *(ushort *)(in_RDI + 0xb36);
            uVar7 = local_34 + uVar2;
            if ((uVar7 < 0x40) && (local_34 < 0x40)) {
              local_40 = (ulong)uVar1 << (bVar3 & 0x3f) | local_40;
              local_34 = uVar7;
            }
            else if (local_34 < 0x40) {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)(uVar1 >> (0x40 - bVar3 & 0x3f));
              local_34 = uVar7 - 0x40;
            }
            else {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)uVar1;
              local_34 = (uint)uVar2;
            }
            uVar8 = (long)iVar5 - 0xb;
            in_stack_ffffffffffffff44 = 7;
            in_stack_ffffffffffffff40 = local_34 + 7;
            if ((in_stack_ffffffffffffff40 < 0x40) && (local_34 < 0x40)) {
              local_40 = uVar8 << ((byte)local_34 & 0x3f) | local_40;
              local_34 = in_stack_ffffffffffffff40;
            }
            else if (local_34 < 0x40) {
              put_uint64((deflate_state *)CONCAT44(7,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = uVar8 >> (0x40 - (byte)local_34 & 0x3f);
              local_34 = in_stack_ffffffffffffff40 - 0x40;
            }
            else {
              put_uint64((deflate_state *)CONCAT44(7,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = uVar8;
              local_34 = in_stack_ffffffffffffff44;
            }
          }
        }
        else {
          if (local_24 != local_1c) {
            uVar1 = *(ushort *)(in_RDI + 0xaec + (long)(int)local_24 * 4);
            uVar7 = (uint)*(ushort *)(in_RDI + 0xaee + (long)(int)local_24 * 4);
            uVar6 = local_34 + uVar7;
            iVar5 = local_28;
            if ((uVar6 < 0x40) && (local_34 < 0x40)) {
              local_40 = (ulong)uVar1 << (bVar3 & 0x3f) | local_40;
              local_34 = uVar6;
            }
            else if (local_34 < 0x40) {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)(uVar1 >> (0x40 - bVar3 & 0x3f));
              local_34 = uVar6 - 0x40;
            }
            else {
              put_uint64((deflate_state *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
              local_40 = (ulong)uVar1;
              local_34 = uVar7;
            }
          }
          local_28 = iVar5;
          uVar1 = *(ushort *)(in_RDI + 0xb2c);
          uVar2 = *(ushort *)(in_RDI + 0xb2e);
          uVar7 = local_34 + uVar2;
          if ((uVar7 < 0x40) && (local_34 < 0x40)) {
            local_40 = (ulong)uVar1 << ((byte)local_34 & 0x3f) | local_40;
            local_34 = uVar7;
          }
          else if (local_34 < 0x40) {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_40 = (ulong)(uVar1 >> (0x40 - (byte)local_34 & 0x3f));
            local_34 = uVar7 - 0x40;
          }
          else {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_40 = (ulong)uVar1;
            local_34 = (uint)uVar2;
          }
          uVar8 = (long)local_28 - 3;
          if ((local_34 + 2 < 0x40) && (local_34 < 0x40)) {
            local_40 = uVar8 << ((byte)local_34 & 0x3f) | local_40;
            local_34 = local_34 + 2;
          }
          else if (local_34 < 0x40) {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_40 = uVar8 >> (0x40 - (byte)local_34 & 0x3f);
            local_34 = local_34 - 0x3e;
          }
          else {
            put_uint64((deflate_state *)
                       CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
            local_34 = 2;
            local_40 = uVar8;
          }
        }
      }
      local_28 = 0;
      local_1c = local_24;
      iVar5 = local_28;
      if (uVar4 == 0) {
        local_2c = 0x8a;
        local_30 = 3;
      }
      else if (local_24 == uVar4) {
        local_2c = 6;
        local_30 = 3;
      }
      else {
        local_2c = 7;
        local_30 = 4;
      }
    }
    local_28 = iVar5;
    local_24 = uVar4;
  }
  *(ulong *)(in_RDI + 0x1778) = local_40;
  *(uint *)(in_RDI + 0x1780) = local_34;
  return;
}

Assistant:

static void send_tree(deflate_state *s, ct_data *tree, int max_code) {
    /* tree: the tree to be scanned */
    /* max_code and its largest code of non zero frequency */
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0)
        max_count = 138, min_count = 3;

    // Temp local variables
    uint32_t bi_valid = s->bi_valid;
    uint64_t bi_buf = s->bi_buf;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen;
        nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
            } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree, bi_buf, bi_valid);
                count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 2, bi_buf, bi_valid);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-3, 3, bi_buf, bi_valid);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree, bi_buf, bi_valid);
            send_bits(s, count-11, 7, bi_buf, bi_valid);
        }
        count = 0;
        prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }

    // Store back temp variables
    s->bi_buf = bi_buf;
    s->bi_valid = bi_valid;
}